

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

TestCaseType xe::getTestCaseTypeFromPath(char *casePath)

{
  deBool dVar1;
  char *str;
  char *group;
  char *casePath_local;
  
  dVar1 = deStringBeginsWith(casePath,"dEQP-GLES2.");
  if (dVar1 != 0) {
    str = casePath + 0xb;
    dVar1 = deStringBeginsWith(str,"capability.");
    if (dVar1 != 0) {
      return TESTCASETYPE_CAPABILITY;
    }
    dVar1 = deStringBeginsWith(str,"accuracy.");
    if (dVar1 != 0) {
      return TESTCASETYPE_ACCURACY;
    }
    dVar1 = deStringBeginsWith(str,"performance.");
    if (dVar1 != 0) {
      return TESTCASETYPE_PERFORMANCE;
    }
  }
  return TESTCASETYPE_SELF_VALIDATE;
}

Assistant:

static TestCaseType getTestCaseTypeFromPath (const char* casePath)
{
	if (deStringBeginsWith(casePath, "dEQP-GLES2."))
	{
		const char* group = casePath+11;
		if (deStringBeginsWith(group, "capability."))
			return TESTCASETYPE_CAPABILITY;
		else if (deStringBeginsWith(group, "accuracy."))
			return TESTCASETYPE_ACCURACY;
		else if (deStringBeginsWith(group, "performance."))
			return TESTCASETYPE_PERFORMANCE;
	}

	return TESTCASETYPE_SELF_VALIDATE;
}